

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetGlobalRecordTest_Test::TestBody(Psbt_SetGlobalRecordTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  char *in_R9;
  AssertHelper local_668;
  Message local_660;
  ByteData local_658;
  string local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_7;
  ByteData global_tx_key;
  Message local_5f0;
  string local_5e8;
  string local_5c8;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_6;
  Message local_590;
  string local_588;
  string local_568;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_5;
  Message local_530;
  size_type local_528;
  int local_51c;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_4;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  Message local_4e8;
  string local_4e0;
  string local_4c0;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_3;
  Message local_488;
  string local_480;
  string local_460;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_2;
  ByteData get_gval2;
  ByteData get_gval1;
  undefined1 local_3e8 [8];
  Psbt psbt2;
  Message local_390;
  string local_388;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_1;
  Message local_350;
  ByteData local_348;
  string local_330;
  undefined1 local_310 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_250;
  Message local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_;
  string local_220;
  undefined1 local_200 [8];
  ByteData global_value2;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  undefined1 local_198 [8];
  ByteData global_key2;
  string local_178;
  undefined1 local_158 [8];
  ByteData global_value1;
  string local_138;
  allocator local_111;
  string local_110;
  undefined1 local_f0 [8];
  ByteData global_key1;
  Psbt psbt;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  Transaction tx;
  Psbt_SetGlobalRecordTest_Test *this_local;
  
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000"
             ,&local_71);
  cfd::core::Transaction::Transaction((Transaction *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cfd::core::Psbt::Psbt
            ((Psbt *)&global_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Transaction *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"cfd",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"dummy1",
             (allocator *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_f0,0xfc,&local_110,'\0',&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_178,"01020304",
             (allocator *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_158,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"cfd",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e0,"dummy2",
             (allocator *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_198,0xfc,&local_1b8,'\0',&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_220,"00",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_200,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::Psbt::SetGlobalRecord
            ((Psbt *)&global_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(ByteData *)local_f0,
             (ByteData *)local_158);
  local_239 = cfd::core::Psbt::IsFindGlobalRecord
                        ((Psbt *)&global_key1.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (ByteData *)local_f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_238,
               (AssertionResult *)"psbt.IsFindGlobalRecord(global_key1)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x39b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  bVar1 = cfd::core::Psbt::IsFindGlobalRecord
                    ((Psbt *)&global_key1.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (ByteData *)local_198);
  local_281 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_280,
               (AssertionResult *)"psbt.IsFindGlobalRecord(global_key2)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x39c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  cfd::core::Psbt::SetGlobalRecord
            ((Psbt *)&global_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(ByteData *)local_198,
             (ByteData *)local_200);
  local_2c9 = cfd::core::Psbt::IsFindGlobalRecord
                        ((Psbt *)&global_key1.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (ByteData *)local_198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2c8,
               (AssertionResult *)"psbt.IsFindGlobalRecord(global_key2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x39e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  cfd::core::Psbt::GetData
            (&local_348,
             (Psbt *)&global_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_330,&local_348);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_310,
             "\"70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000dfc03636664000664756d6d793104010203040dfc03636664000664756d6d793201000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000dfc03636664000664756d6d793104010203040dfc03636664000664756d6d793201000000000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_330);
  cfd::core::ByteData::~ByteData(&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3a0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  cfd::core::Psbt::GetBase64_abi_cxx11_
            (&local_388,
             (Psbt *)&global_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_368,
             "\"cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAAAAAA=="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3a1,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_390);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Psbt *)&global_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::Psbt
            ((Psbt *)local_3e8,
             (ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetGlobalRecord
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_3e8,
             (ByteData *)local_f0);
  cfd::core::Psbt::GetGlobalRecord
            ((ByteData *)&gtest_ar_2.message_,(Psbt *)local_3e8,(ByteData *)local_198);
  cfd::core::ByteData::GetHex_abi_cxx11_
            (&local_460,
             (ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_480,(ByteData *)local_158);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_440,"get_gval1.GetHex()","global_value1.GetHex()",&local_460,
             &local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3a6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_4c0,(ByteData *)&gtest_ar_2.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_4e0,(ByteData *)local_200);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_4a0,"get_gval2.GetHex()","global_value2.GetHex()",&local_4c0,
             &local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3a7,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  cfd::core::Psbt::GetGlobalRecordKeyList
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_4.message_,(Psbt *)local_3e8);
  local_51c = 2;
  local_528 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &gtest_ar_4.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_518,"2","key_list.size()",&local_51c,&local_528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3aa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  sVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar_4.message_);
  if (sVar3 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_568,(ByteData *)local_f0);
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        &gtest_ar_4.message_,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_588,pvVar4);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_548,"global_key1.GetHex()","key_list[0].GetHex()",&local_568
               ,&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_568);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
    if (!bVar1) {
      testing::Message::Message(&local_590);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x3ac,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_590);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_590);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_5c8,(ByteData *)local_198);
    pvVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        &gtest_ar_4.message_,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_5e8,pvVar4);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_5a8,"global_key2.GetHex()","key_list[1].GetHex()",&local_5c8
               ,&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_5c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
    if (!bVar1) {
      testing::Message::Message(&local_5f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &global_tx_key.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x3ad,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &global_tx_key.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_5f0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &global_tx_key.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_5f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  }
  cfd::core::Psbt::CreateRecordKey((ByteData *)&gtest_ar_7.message_,'\0');
  cfd::core::Psbt::GetGlobalRecord(&local_658,(Psbt *)local_3e8,(ByteData *)&gtest_ar_7.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_640,&local_658);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_620,
             "\"0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000\""
             ,"psbt2.GetGlobalRecord(global_tx_key).GetHex().c_str()",
             "0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_640);
  cfd::core::ByteData::~ByteData(&local_658);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_668,&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_7.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_4.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_2.message_);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::~Psbt((Psbt *)local_3e8);
  cfd::core::ByteData::~ByteData((ByteData *)local_200);
  cfd::core::ByteData::~ByteData((ByteData *)local_198);
  cfd::core::ByteData::~ByteData((ByteData *)local_158);
  cfd::core::ByteData::~ByteData((ByteData *)local_f0);
  cfd::core::Psbt::~Psbt
            ((Psbt *)&global_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::Transaction::~Transaction((Transaction *)local_50);
  return;
}

Assistant:

TEST(Psbt, SetGlobalRecordTest) {
  Transaction tx("0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000");
  Psbt psbt(tx);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetGlobalRecord(global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindGlobalRecord(global_key1));
  EXPECT_FALSE(psbt.IsFindGlobalRecord(global_key2));
  psbt.SetGlobalRecord(global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindGlobalRecord(global_key2));

  EXPECT_STREQ("70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000dfc03636664000664756d6d793104010203040dfc03636664000664756d6d793201000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_gval1 = psbt2.GetGlobalRecord(global_key1);
  auto get_gval2 = psbt2.GetGlobalRecord(global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetGlobalRecordKeyList();
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }

  ByteData global_tx_key = Psbt::CreateRecordKey(Psbt::kPsbtGlobalUnsignedTx);
  EXPECT_STREQ(
      "0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000",
      psbt2.GetGlobalRecord(global_tx_key).GetHex().c_str());
}